

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render.c
# Opt level: O2

_Bool render_tour_image(char *filepath,Instance *instance,Tour *tour,char *filext)

{
  int iVar1;
  Vec2d *pVVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  FILE *__s;
  int32_t *piVar6;
  uint *puVar7;
  long lVar8;
  int32_t i_1;
  int iVar9;
  long lVar10;
  long lVar11;
  int32_t i;
  ulong uVar12;
  int iVar13;
  bool bVar14;
  _Bool _Var15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  char command [8192];
  
  pcVar4 = guess_plot_filext(filepath,filext);
  iVar1 = instance->num_customers;
  lVar11 = (long)iVar1;
  lVar5 = -1;
  if (-1 < lVar11) {
    lVar5 = lVar11;
  }
  lVar5 = lVar5 + 1;
  dVar19 = -9999999.0;
  lVar8 = 0;
  dVar21 = -9999999.0;
  dVar20 = 99999999.0;
  dVar22 = 9999999.0;
  while (bVar14 = lVar5 != 0, lVar5 = lVar5 + -1, bVar14) {
    dVar16 = *(double *)((long)&instance->positions->x + lVar8);
    dVar17 = dVar16;
    if (dVar22 <= dVar16) {
      dVar17 = dVar22;
    }
    if (dVar19 <= dVar16) {
      dVar19 = dVar16;
    }
    if (dVar21 <= dVar16) {
      dVar21 = dVar16;
    }
    if (dVar20 <= dVar16) {
      dVar16 = dVar20;
    }
    lVar8 = lVar8 + 0x10;
    dVar20 = dVar16;
    dVar22 = dVar17;
  }
  dVar19 = dVar19 - dVar22;
  dVar16 = 9999999999.0;
  lVar5 = 0;
  for (lVar8 = 0; lVar8 <= lVar11; lVar8 = lVar8 + 1) {
    for (lVar10 = 0; (ulong)(iVar1 + 1) << 4 != lVar10; lVar10 = lVar10 + 0x10) {
      if (lVar5 != lVar10) {
        pVVar2 = instance->positions;
        dVar17 = *(double *)((long)&pVVar2->x + lVar10) - pVVar2[lVar8].x;
        dVar18 = *(double *)((long)&pVVar2->y + lVar10) - pVVar2[lVar8].y;
        dVar17 = SQRT(dVar17 * dVar17 + dVar18 * dVar18);
        if (dVar17 <= dVar16) {
          dVar16 = dVar17;
        }
      }
    }
    lVar5 = lVar5 + 0x10;
  }
  if (dVar16 < 0.0) {
    dVar16 = sqrt(dVar16);
  }
  else {
    dVar16 = SQRT(dVar16);
  }
  _Var15 = false;
  memset(command,0,0x2000);
  snprintf(command,0x2000,"neato \'-T%s\' -o \'%s\' 1> /dev/null 2>/dev/null",pcVar4,filepath);
  command[0x1fff] = '\0';
  log_log(0x20,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/render.c"
          ,0x6f,"%s :: Running popen(%s)\n","render_tour_image",command);
  __s = popen(command,"w");
  if (__s != (FILE *)0x0) {
    dVar21 = dVar21 - dVar20;
    dVar17 = dVar19;
    if (dVar21 <= dVar19) {
      dVar17 = dVar21;
    }
    fwrite("strict digraph {\n",0x11,1,__s);
    fwrite("    labelloc=\"t\"\n",0x11,1,__s);
    fwrite("    graph [pad=\"0.212, 0.055\", bgcolor=white, fontname = \"monospace\"]\n",0x46,1,__s)
    ;
    fwrite("    node [style=filled]\n",0x18,1,__s);
    lVar5 = 8;
    for (uVar12 = 0; (long)uVar12 <= lVar11; uVar12 = uVar12 + 1) {
      fprintf(__s,
              "    %d [fillcolor=\"#dddddd\" pos=\"%f,%f!\" pin=\"true\" shape=\"circle\" label=\"%d\"]\n"
              ,((*(double *)((long)instance->positions + lVar5 + -8) - dVar22) / dVar19) /
               (dVar16 / dVar17),
              ((*(double *)((long)&instance->positions->x + lVar5) - dVar20) / dVar21) /
              (dVar16 / dVar17),uVar12 & 0xffffffff,uVar12 & 0xffffffff);
      lVar5 = lVar5 + 0x10;
    }
    if (tour->num_comps != 1) {
      __assert_fail("tour->num_comps == 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/render.c"
                    ,0x8b,
                    "_Bool render_tour_image(const char *, const Instance *, Tour *, const char *)")
      ;
    }
    iVar9 = 1;
    for (iVar13 = 0; iVar13 < iVar9; iVar13 = iVar13 + 1) {
      iVar9 = 0;
      while( true ) {
        if (iVar1 < iVar9) goto LAB_00105a5f;
        piVar6 = veci32_access(tour->comp,iVar9,tour->num_customers + 1);
        if (*piVar6 == iVar13) break;
        iVar9 = iVar9 + 1;
      }
      if (iVar9 != 0) {
LAB_00105a5f:
        __assert_fail("first_node_in_comp == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/render.c"
                      ,0x96,
                      "_Bool render_tour_image(const char *, const Instance *, Tour *, const char *)"
                     );
      }
      uVar12 = 0;
      while( true ) {
        puVar7 = (uint *)veci32_access(tour->succ,(int32_t)uVar12,tour->num_customers + 1);
        uVar3 = *puVar7;
        if (uVar3 == 0) break;
        fprintf(__s,"   %d -> %d [fontsize=\"8\"]\n",uVar12,(ulong)uVar3);
        uVar12 = (ulong)uVar3;
      }
      fprintf(__s,"   %d -> %d [fontsize=\"8\"]\n",uVar12,0);
      iVar9 = tour->num_comps;
    }
    fwrite("}\n",2,1,__s);
    uVar3 = pclose(__s);
    log_log(0x20,
            "/workspace/llm4binary/github/license_all_cmakelists_1510/dparo[P]master-thesis/src/render.c"
            ,0xb0,"%s :: graphviz dump creation process terminated with exit code %d",
            "render_tour_image",(ulong)uVar3);
    _Var15 = uVar3 == 0;
  }
  return _Var15;
}

Assistant:

bool render_tour_image(const char *filepath, const Instance *instance,
                       Tour *tour, const char *filext) {

    // Try to autodetect the filepath
    filext = guess_plot_filext(filepath, filext);

    int32_t n = instance->num_customers + 1;
    bool result = true;

    double min_dist = 9999999999;
    double smaller_coord = 9999999999;
    double llx, lly, w, h;

    compute_plotting_region(instance, &llx, &lly, &w, &h);

    for (int32_t i = 0; i < n; i++) {
        for (int32_t j = 0; j < n; j++) {
            if (i != j) {
                const Vec2d *ipos = &instance->positions[i];
                const Vec2d *jpos = &instance->positions[j];

                smaller_coord = MIN(smaller_coord, ipos->x);
                smaller_coord = MIN(smaller_coord, ipos->y);
                smaller_coord = MIN(smaller_coord, jpos->x);
                smaller_coord = MIN(smaller_coord, jpos->y);

                double d = vec2d_dist(ipos, jpos);
                min_dist = MIN(min_dist, d);
            }
        }
    }

    min_dist = sqrt(min_dist) / MIN(w, h);

    // min_dist = exp(min_dist);

    char command[8192] = "";

    snprintf(command, ARRAY_LEN(command),
             "neato '-T%s' -o '%s' 1> /dev/null 2>/dev/null", filext, filepath);
    command[ARRAY_LEN(command) - 1] = '\0';

    log_info("%s :: Running popen(%s)\n", __func__, command);

    FILE *gp = popen(command, "w");
    if (!gp) {
        result = false;
        goto terminate;
    }

    fprintf(gp, "strict digraph {\n");
    fprintf(gp, "    labelloc=\"t\"\n");
    fprintf(gp, "    graph [pad=\"0.212, 0.055\", bgcolor=white, fontname = "
                "\"monospace\"]\n");
    fprintf(gp, "    node [style=filled]\n");

    //
    // Declare the nodes and style them. Apply some size normalization for the
    // output render target.
    //
    for (int32_t i = 0; i < n; i++) {
        const Vec2d *pos = &instance->positions[i];

        fprintf(gp,
                "    %d [fillcolor=\"#dddddd\" pos=\"%f,%f!\" pin=\"true\" "
                "shape=\"circle\" label=\"%d\"]\n",
                i, ((pos->x - llx) / w / min_dist),
                ((pos->y - lly) / h / min_dist), i);
    }

    assert(tour->num_comps == 1);

    for (int32_t comp = 0; comp < tour->num_comps; comp++) {
        int32_t first_node_in_comp = -1;
        for (int32_t i = 0; i < n; i++) {
            if (*tcomp(tour, i) == comp) {
                first_node_in_comp = i;
                break;
            }
        }

        assert(first_node_in_comp == 0);

        if (first_node_in_comp != -1) {

            int32_t curr_vertex = first_node_in_comp;
            int32_t next_vertex = curr_vertex;

            while ((next_vertex = *tsucc(tour, curr_vertex)) !=
                   first_node_in_comp) {
                fprintf(gp, "   %d -> %d [fontsize=\"8\"]\n", curr_vertex,
                        next_vertex);
                curr_vertex = next_vertex;
            }
            assert(next_vertex == first_node_in_comp);
            fprintf(gp, "   %d -> %d [fontsize=\"8\"]\n", curr_vertex,
                    first_node_in_comp);
        }
    }

    fprintf(gp, "}\n");

terminate:
    if (gp) {
        int exit_code = pclose(gp);
        log_info("%s :: graphviz dump creation process terminated with "
                 "exit code %d",
                 __func__, exit_code);
        result = exit_code == 0;
    }

    return result;
}